

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExtraData.cpp
# Opt level: O2

void __thiscall
ExtraData::parseDECIMAL
          (ExtraData *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *val,int pos)

{
  uint uVar1;
  ostream *poVar2;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_60;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"                DECIMAL:            ");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"                 wReserved:         ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<(poVar2," ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<(poVar2,(string *)&Utils::defaultOffsetDocInfo_abi_cxx11_);
  poVar2 = std::operator<<(poVar2,"MUST be set to zero and MUST be ignored. ");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"                 scale:             ");
  *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
       *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 2;
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<(poVar2,(string *)&Utils::defaultOffsetDocInfo_abi_cxx11_);
  poVar2 = std::operator<<(poVar2,"Order of magnitude of the decimal number. ");
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(poVar2,(string *)&Utils::defaultOffsetDocInfo_abi_cxx11_);
  poVar2 = std::operator<<(poVar2,
                           "MUST be the power of 10 by which to divide the 96-bit integer represented by Hi32 * 2^64 + Lo64. "
                          );
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(poVar2,(string *)&Utils::defaultOffsetDocInfo_abi_cxx11_);
  poVar2 = std::operator<<(poVar2,"The value MUST be in the range of 0 to 28, inclusive. ");
  std::endl<char,std::char_traits<char>>(poVar2);
  std::operator<<((ostream *)&std::cout,"                 sign:              ");
  uVar1 = (val->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_start[(long)pos + 3];
  if (uVar1 == 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,(string *)&Utils::defaultOffset_abi_cxx11_);
    poVar2 = std::operator<<(poVar2,"The decimal contains a positive value. ");
    std::endl<char,std::char_traits<char>>(poVar2);
    uVar1 = (val->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_start[(long)pos + 3];
  }
  if (uVar1 == 0x80) {
    poVar2 = std::operator<<((ostream *)&std::cout,(string *)&Utils::defaultOffset_abi_cxx11_);
    poVar2 = std::operator<<(poVar2,"The decimal contains a negative value. ");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  poVar2 = std::operator<<((ostream *)&std::cout,(string *)&Utils::defaultOffsetDocInfo_abi_cxx11_);
  poVar2 = std::operator<<(poVar2,"MUST equalMUST equal to 0 or 0x80.");
  std::endl<char,std::char_traits<char>>(poVar2);
  std::operator<<((ostream *)&std::cout,"                 Hi32:              ");
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48,val);
  Utils::print_vec_from_to
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48,pos + 4,pos + 8);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_48);
  poVar2 = std::operator<<((ostream *)&std::cout,(string *)&Utils::defaultOffsetDocInfo_abi_cxx11_);
  poVar2 = std::operator<<(poVar2,"MUST be the high 32 bits of the 96-bit integer ");
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(poVar2,(string *)&Utils::defaultOffsetDocInfo_abi_cxx11_);
  poVar2 = std::operator<<(poVar2,"that is scaled and signed to represent the final DECIMAL value. "
                          );
  std::endl<char,std::char_traits<char>>(poVar2);
  std::operator<<((ostream *)&std::cout,"                 Lo64:              ");
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_60,val);
  Utils::print_vec_from_to
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_60,pos + 8,pos + 0x10);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_60);
  poVar2 = std::operator<<((ostream *)&std::cout,(string *)&Utils::defaultOffsetDocInfo_abi_cxx11_);
  poVar2 = std::operator<<(poVar2,"MUST be the low 64 bits of the 96-bit integer");
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(poVar2,(string *)&Utils::defaultOffsetDocInfo_abi_cxx11_);
  poVar2 = std::operator<<(poVar2,"that is scaled and signed to represent the final DECIMAL value.")
  ;
  std::endl<char,std::char_traits<char>>(poVar2);
  return;
}

Assistant:

void ExtraData::parseDECIMAL(std::vector<unsigned int> val, int pos) {
    cout << "                DECIMAL:            " << endl;
    cout << "                 wReserved:         " << val[pos] << " " << val[pos+1] <<
         Utils::defaultOffsetDocInfo << "MUST be set to zero and MUST be ignored. " << endl;
    cout << "                 scale:             " << dec << val[pos+2] <<
         Utils::defaultOffsetDocInfo << "Order of magnitude of the decimal number. " << endl <<
         Utils::defaultOffsetDocInfo << "MUST be the power of 10 by which to divide the 96-bit integer represented by Hi32 * 2^64 + Lo64. " << endl <<
         Utils::defaultOffsetDocInfo << "The value MUST be in the range of 0 to 28, inclusive. " << endl;
    cout << "                 sign:              ";
    if(val[pos+3] == 0)
        cout << Utils::defaultOffset << "The decimal contains a positive value. " << endl;
    if(val[pos+3] == 0x80)
        cout << Utils::defaultOffset << "The decimal contains a negative value. " << endl;
    cout << Utils::defaultOffsetDocInfo << "MUST equalMUST equal to 0 or 0x80." << endl;
    cout << "                 Hi32:              "; Utils::print_vec_from_to(val, pos+4, pos+8);
    cout << Utils::defaultOffsetDocInfo << "MUST be the high 32 bits of the 96-bit integer " << endl <<
         Utils::defaultOffsetDocInfo << "that is scaled and signed to represent the final DECIMAL value. " << endl;
    cout << "                 Lo64:              "; Utils::print_vec_from_to(val, pos+8, pos+16);
    cout << Utils::defaultOffsetDocInfo << "MUST be the low 64 bits of the 96-bit integer" << endl <<
         Utils::defaultOffsetDocInfo << "that is scaled and signed to represent the final DECIMAL value." << endl;
}